

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_adjacency_subgraph.cpp
# Opt level: O2

void __thiscall
Adjacency_Subgraph_degree_Test::Adjacency_Subgraph_degree_Test(Adjacency_Subgraph_degree_Test *this)

{
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__Test_0016a2d8;
  return;
}

Assistant:

TEST(Adjacency_Subgraph, degree) {
  Adjacency_Graph<false> graph = create_graph_structured<false>(3);

  // Test degree on primary subgraph.
  Adjacency_Subgraph subgraph(graph, {1, 3, 4, 5, 7});
  EXPECT_EQ(subgraph.degree(0), 1);
  EXPECT_EQ(subgraph.degree(1), 1);
  EXPECT_EQ(subgraph.degree(2), 4);
  EXPECT_EQ(subgraph.degree(3), 1);
  EXPECT_EQ(subgraph.degree(4), 1);

  // Test degree on both level and primary parts of the subgraph.
  subgraph = Adjacency_Subgraph(graph, {4}, 1);
  EXPECT_EQ(subgraph.degree(0), 4);
  EXPECT_EQ(subgraph.degree(1), 1);
  EXPECT_EQ(subgraph.degree(2), 1);
  EXPECT_EQ(subgraph.degree(3), 1);
  EXPECT_EQ(subgraph.degree(4), 1);
}